

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isIDPart_63(UChar32 c)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  bool local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint32_t props;
  UChar32 c_local;
  
  uVar2 = c >> 5;
  if ((uint)c < 0xd800) {
    local_1c = (uint)propsTrie_index[(int)uVar2] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar3 = 0;
      if (c < 0xdc00) {
        iVar3 = 0x140;
      }
      local_20 = (uint)propsTrie_index[(int)(iVar3 + uVar2)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0x110000) {
          local_28 = (uint)propsTrie_index
                           [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_28 = 0x53c8;
        }
        local_24 = local_28;
      }
      else {
        local_24 = 0x11f4;
      }
      local_20 = local_24;
    }
    local_1c = local_20;
  }
  local_29 = true;
  if ((1 << ((byte)propsTrie_index[local_1c] & 0x1f) & 0x40077eU) == 0) {
    UVar1 = u_isIDIgnorable_63(c);
    local_29 = UVar1 != '\0';
  }
  return local_29;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isIDPart(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    return (UBool)(
           (CAT_MASK(props)&
            (U_GC_ND_MASK|U_GC_NL_MASK|
             U_GC_L_MASK|
             U_GC_PC_MASK|U_GC_MC_MASK|U_GC_MN_MASK)
           )!=0 ||
           u_isIDIgnorable(c));
}